

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int readImmediate(InternalInstruction *insn,uint8_t size)

{
  int iVar1;
  ulong in_RAX;
  uint offset_1;
  uint uVar2;
  uint64_t uVar3;
  uint offset;
  long lVar4;
  byte bVar5;
  bool bVar6;
  uint8_t imm8;
  uint8_t byte_1;
  uint8_t byte;
  uint8_t byte_2;
  undefined8 uStack_38;
  
  if (insn->numImmediatesConsumed == '\x02') {
    return -1;
  }
  if (size == '\0') {
    size = insn->immediateSize;
  }
  else {
    insn->immediateSize = size;
  }
  insn->immediateOffset = (char)insn->readerCursor - (char)(int)insn->startLocation;
  uStack_38 = in_RAX;
  switch(size) {
  case '\x01':
    iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 4),
                            insn->readerCursor);
    if (iVar1 != 0) {
      return -1;
    }
    insn->readerCursor = insn->readerCursor + 1;
    uVar3 = uStack_38 >> 0x20 & 0xff;
    goto LAB_001a7654;
  case '\x02':
    bVar5 = 0;
    lVar4 = 0;
    uVar2 = 0;
    do {
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 5),
                              insn->readerCursor + lVar4);
      if (iVar1 != 0) goto LAB_001a763e;
      uVar2 = uVar2 | (uint)uStack_38._5_1_ << (bVar5 & 0x3f);
      lVar4 = lVar4 + 1;
      bVar5 = bVar5 + 8;
    } while (lVar4 == 1);
    insn->readerCursor = insn->readerCursor + 2;
    uVar3 = (uint64_t)(uVar2 & 0xffff);
    break;
  default:
    goto switchD_001a74f4_caseD_3;
  case '\x04':
    bVar5 = 0;
    lVar4 = 0;
    uVar2 = 0;
    do {
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 6),
                              insn->readerCursor + lVar4);
      if (iVar1 != 0) goto LAB_001a763e;
      uVar2 = uVar2 | (uint)uStack_38._6_1_ << (bVar5 & 0x3f);
      lVar4 = lVar4 + 1;
      bVar5 = bVar5 + 8;
    } while (lVar4 != 4);
    insn->readerCursor = insn->readerCursor + 4;
    uVar3 = (uint64_t)uVar2;
    break;
  case '\b':
    bVar5 = 0;
    lVar4 = 0;
    uVar3 = 0;
    do {
      iVar1 = (*insn->reader)((reader_info *)insn->readerArg,(uint8_t *)((long)&uStack_38 + 7),
                              insn->readerCursor + lVar4);
      if (iVar1 != 0) {
        bVar6 = iVar1 == 0;
        goto LAB_001a764b;
      }
      uVar3 = uVar3 | (uStack_38 >> 0x38) << (bVar5 & 0x3f);
      lVar4 = lVar4 + 1;
      bVar5 = bVar5 + 8;
    } while (lVar4 != 8);
    insn->readerCursor = insn->readerCursor + 8;
  }
  bVar6 = true;
LAB_001a764b:
  iVar1 = -1;
  if (bVar6) {
LAB_001a7654:
    insn->immediates[insn->numImmediatesConsumed] = uVar3;
switchD_001a74f4_caseD_3:
    insn->numImmediatesConsumed = insn->numImmediatesConsumed + '\x01';
    iVar1 = 0;
  }
  return iVar1;
LAB_001a763e:
  bVar6 = iVar1 == 0;
  uVar3 = 0;
  goto LAB_001a764b;
}

Assistant:

static int readImmediate(struct InternalInstruction *insn, uint8_t size)
{
	uint8_t imm8;
	uint16_t imm16;
	uint32_t imm32;
	uint64_t imm64;

	// dbgprintf(insn, "readImmediate()");

	if (insn->numImmediatesConsumed == 2) {
		//debug("Already consumed two immediates");
		return -1;
	}

	if (size == 0)
		size = insn->immediateSize;
	else
		insn->immediateSize = size;
	insn->immediateOffset = (uint8_t)(insn->readerCursor - insn->startLocation);

	switch (size) {
		case 1:
			if (consumeByte(insn, &imm8))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm8;
			break;
		case 2:
			if (consumeUInt16(insn, &imm16))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm16;
			break;
		case 4:
			if (consumeUInt32(insn, &imm32))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm32;
			break;
		case 8:
			if (consumeUInt64(insn, &imm64))
				return -1;
			insn->immediates[insn->numImmediatesConsumed] = imm64;
			break;
	}

	insn->numImmediatesConsumed++;

	return 0;
}